

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

QSize __thiscall QMdiSubWindow::sizeHint(QMdiSubWindow *this)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long in_FS_OFFSET;
  int minWidth;
  int margin;
  int local_38;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  local_34 = -0x55555556;
  local_38 = -0x55555556;
  QMdiSubWindowPrivate::sizeParameters(this_00,&local_34,&local_38);
  iVar3 = local_34;
  uVar8 = local_34 * 2;
  iVar4 = QMdiSubWindowPrivate::titleBarHeight(this_00);
  uVar10 = iVar4 + iVar3;
  pDVar1 = (this_00->baseWidget).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     (pQVar2 = (this_00->baseWidget).wp.value, pQVar2 != (QObject *)0x0)) {
    uVar5 = (**(code **)(*(long *)pQVar2 + 0x70))();
    if ((uVar5 & 0x8000000080000000) == 0) {
      uVar6 = (**(code **)(*(long *)(this_00->baseWidget).wp.value + 0x70))();
      uVar8 = uVar8 + (int)uVar6;
      uVar10 = uVar10 + (int)((ulong)uVar6 >> 0x20);
    }
  }
  uVar5 = (**(code **)(*(long *)&this->super_QWidget + 0x78))(this);
  uVar7 = uVar5 >> 0x20;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 <= (int)uVar5) {
    uVar9 = uVar5 & 0xffffffff;
  }
  if ((int)(uVar5 >> 0x20) < (int)uVar10) {
    uVar7 = (ulong)uVar10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QSize)(uVar9 | uVar7 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QMdiSubWindow::sizeHint() const
{
    Q_D(const QMdiSubWindow);
    int margin, minWidth;
    d->sizeParameters(&margin, &minWidth);
    QSize size(2 * margin, d->titleBarHeight() + margin);
    if (d->baseWidget && d->baseWidget->sizeHint().isValid())
        size += d->baseWidget->sizeHint();
    return size.expandedTo(minimumSizeHint());
}